

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

Result init_emulator(Emulator *e,EmulatorInit *init)

{
  byte bVar1;
  CgbFlag CVar2;
  ulong uVar3;
  bool bVar4;
  EmulatorState *pEVar5;
  Apu *pAVar6;
  EmulatorInit *pEVar7;
  Result RVar8;
  void *pvVar9;
  u32 uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  Bool BVar14;
  CartInfo *pCVar15;
  size_t offset;
  char *pcVar16;
  u8 *puVar17;
  u8 checksum;
  byte bVar18;
  uint uVar19;
  long lVar20;
  char *pcVar21;
  bool bVar22;
  uchar title [17];
  u32 random_seed;
  size_t local_68 [2];
  undefined1 local_58;
  CartInfo *local_50;
  size_t local_48;
  EmulatorInit *local_40;
  u32 local_34;
  
  local_68[0] = (e->file_data).size;
  pCVar15 = e->cart_infos;
  lVar20 = 0;
  offset = 0;
  local_50 = pCVar15;
  local_48 = local_68[0];
  local_40 = init;
  do {
    if ((e->file_data).size < offset + 0x8000) break;
    RVar8 = get_cart_info((FileData *)(e->file_data).data,offset,pCVar15,TRUE,local_68);
    if (RVar8 == OK) {
      if (s_cart_type_info[pCVar15->cart_type].mbc_type == MBC_TYPE_MMM01) goto LAB_0018afff;
      e->cart_info_count = e->cart_info_count + 1;
    }
    lVar20 = lVar20 + 1;
    pCVar15 = pCVar15 + 1;
    offset = offset + 0x8000;
  } while (lVar20 != 0x100);
  if (e->cart_info_count == 0) {
    RVar8 = get_cart_info((FileData *)(e->file_data).data,0,local_50,FALSE,local_68);
    uVar10 = e->cart_info_count;
    if (RVar8 == OK) {
      uVar10 = uVar10 + 1;
      e->cart_info_count = uVar10;
    }
    if (uVar10 == 0) {
      init_emulator_cold_1();
      return ERROR;
    }
  }
  lVar20 = 0;
LAB_0018afff:
  if (local_48 < local_68[0]) {
    file_data_resize(&e->file_data,local_68[0]);
    uVar19 = e->cart_info_count;
    if ((ulong)uVar19 != 0) {
      puVar17 = (e->file_data).data;
      lVar12 = 0;
      do {
        *(u8 **)((long)&e->cart_infos[0].data + lVar12) =
             puVar17 + *(long *)((long)&e->cart_infos[0].offset + lVar12);
        lVar12 = lVar12 + 0x30;
      } while ((ulong)uVar19 * 0x30 != lVar12);
    }
  }
  set_cart_info(e,(u8)lVar20);
  pCVar15 = e->cart_info;
  local_68[0] = 0;
  local_68[1] = 0;
  local_58 = 0;
  puVar17 = pCVar15->data + 0x134;
  pvVar9 = memchr(puVar17,0,0x10);
  uVar19 = 0x10;
  if (pvVar9 != (void *)0x0) {
    uVar19 = (int)pvVar9 - (int)puVar17;
  }
  memcpy(local_68,puVar17,(long)(int)uVar19);
  pEVar7 = local_40;
  if (0 < (int)uVar19) {
    uVar11 = 0;
    do {
      if (*(char *)((long)local_68 + uVar11) < ' ') {
        *(undefined1 *)((long)local_68 + uVar11) = 0x20;
      }
      uVar11 = uVar11 + 1;
    } while (uVar19 != uVar11);
  }
  printf("title: \"%s\"\n",local_68);
  pcVar16 = "unknown";
  if ((ulong)pCVar15->cgb_flag < 0xc1) {
    pcVar16 = *(char **)(get_cgb_flag_string_s_strings + (ulong)pCVar15->cgb_flag * 8);
  }
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "unknown";
  }
  printf("cgb flag: %s\n",pcVar16);
  pcVar16 = "unknown";
  if ((ulong)pCVar15->sgb_flag < 4) {
    pcVar16 = *(char **)(get_sgb_flag_string_s_strings + (ulong)pCVar15->sgb_flag * 8);
  }
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "unknown";
  }
  printf("sgb flag: %s\n",pcVar16);
  pcVar16 = "unknown";
  if ((ulong)pCVar15->cart_type < 0x100) {
    pcVar16 = *(char **)(get_cart_type_string_s_strings + (ulong)pCVar15->cart_type * 8);
  }
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "unknown";
  }
  printf("cart type: %s\n",pcVar16);
  pcVar16 = "unknown";
  if ((ulong)pCVar15->rom_size < 9) {
    pcVar16 = *(char **)(get_rom_size_string_s_strings + (ulong)pCVar15->rom_size * 8);
  }
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "unknown";
  }
  printf("rom size: %s\n",pcVar16);
  pcVar16 = "unknown";
  if ((ulong)pCVar15->ext_ram_size < 6) {
    pcVar16 = *(char **)(get_ext_ram_size_string_s_strings + (ulong)pCVar15->ext_ram_size * 8);
  }
  pcVar21 = "unknown";
  if (pcVar16 != (char *)0x0) {
    pcVar21 = pcVar16;
  }
  bVar18 = 0;
  printf("ext ram size: %s\n",pcVar21);
  bVar1 = pCVar15->data[0x14d];
  lVar20 = -0x19;
  do {
    bVar18 = bVar18 + ~pCVar15->data[lVar20 + 0x14d];
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0);
  pcVar16 = "unknown";
  if (*(char **)(get_result_string_s_strings + (ulong)(bVar18 != bVar1) * 8) != (char *)0x0) {
    pcVar16 = *(char **)(get_result_string_s_strings + (ulong)(bVar18 != bVar1) * 8);
  }
  BVar14 = FALSE;
  printf("header checksum: 0x%02x [%s]\n",(ulong)bVar1,pcVar16);
  (e->state).memory_map_state.rom_base[0] = 0;
  (e->state).memory_map_state.rom_base[1] = 0x4000;
  if (pEVar7->force_dmg == FALSE) {
    pCVar15 = e->cart_info;
    CVar2 = pCVar15->cgb_flag;
    bVar22 = (CVar2 & 0xffffffbf) == CGB_FLAG_SUPPORTED;
    (e->state).is_cgb = (uint)bVar22;
    if ((CVar2 | 0x40) != CGB_FLAG_REQUIRED) {
      BVar14 = (Bool)(pCVar15->sgb_flag == SGB_FLAG_SUPPORTED);
    }
  }
  else {
    (e->state).is_cgb = FALSE;
    bVar22 = false;
  }
  (e->state).is_sgb = BVar14;
  (e->state).reg.F.Z = TRUE;
  (e->state).reg.F.N = FALSE;
  (e->state).reg.F.H = TRUE;
  (e->state).reg.F.C = TRUE;
  (e->state).reg.A = bVar22 * '\x10' + '\x01';
  (e->state).reg.field_1 = (anon_union_2_2_e984aa4b_for_Registers_1)0x13;
  (e->state).reg.field_2 = (anon_union_2_2_e984b20b_for_Registers_3)0xd8;
  (e->state).reg.field_3 = (anon_union_2_2_e984c1e8_for_Registers_5)0x14d;
  (e->state).reg.SP = 0xfffe;
  (e->state).reg.PC = 0x100;
  (e->state).interrupt.ime = FALSE;
  (e->state).timer.div_counter = 0xac00;
  (e->state).next_intr_ticks = 0xffffffffffffffff;
  (e->state).serial.next_intr_ticks = 0xffffffffffffffff;
  (e->state).timer.next_intr_ticks = 0xffffffffffffffff;
  (e->state).wram.offset = 0x1000;
  write_apu(e,0x16,0xf1);
  write_apu(e,1,0x80);
  write_apu(e,2,0xf3);
  write_apu(e,4,0x80);
  write_apu(e,0x14,'w');
  write_apu(e,0x15,0xf3);
  (e->state).apu.initialized = TRUE;
  pEVar5 = &e->state;
  (pEVar5->apu).wave.ram[0] = '`';
  (pEVar5->apu).wave.ram[1] = '\r';
  (pEVar5->apu).wave.ram[2] = 0xda;
  (pEVar5->apu).wave.ram[3] = 0xdd;
  (pEVar5->apu).wave.ram[4] = 'P';
  (pEVar5->apu).wave.ram[5] = '\x0f';
  (pEVar5->apu).wave.ram[6] = 0xad;
  (pEVar5->apu).wave.ram[7] = 0xed;
  pAVar6 = &(e->state).apu;
  (pAVar6->wave).ram[8] = 0xc0;
  (pAVar6->wave).ram[9] = 0xde;
  (pAVar6->wave).ram[10] = 0xf0;
  (pAVar6->wave).ram[0xb] = '\r';
  (pAVar6->wave).ram[0xc] = 0xbe;
  (pAVar6->wave).ram[0xd] = 0xef;
  (pAVar6->wave).ram[0xe] = 0xfe;
  (pAVar6->wave).ram[0xf] = 0xed;
  (e->state).apu.channel[0].envelope.volume = '\0';
  pcVar16 = (char *)0x40;
  write_io(e,0x40,0x91);
  HOOK_write_io_asb(e,pcVar16,0x42,"SCY",0);
  ppu_mode3_synchronize(e);
  (e->state).ppu.scy = '\0';
  write_io(e,0x43,'\0');
  write_io(e,0x45,'\0');
  write_io(e,0x47,0xfc);
  write_io(e,0x48,0xff);
  pcVar16 = (char *)0x49;
  write_io(e,0x49,0xff);
  HOOK_write_io_asb(e,pcVar16,0xf,"IF");
  intr_synchronize(e);
  (e->state).interrupt.if_ = '\x01';
  (e->state).interrupt.new_if = '\x01';
  HOOK_write_io_asb(e,pcVar16,0xff,"IE");
  (e->state).interrupt.ie = '\0';
  (e->state).hdma.blocks = 0xff;
  emulator_set_builtin_palette(e,pEVar7->builtin_palette);
  e->cgb_color_curve = pEVar7->cgb_color_curve;
  bVar22 = true;
  do {
    bVar4 = bVar22;
    lVar20 = 0x3398c;
    if (bVar4) {
      lVar20 = 0x338c4;
    }
    uVar11 = 0;
    do {
      *(undefined4 *)
       ((long)(e->config).disable_sound +
       (ulong)((uint)uVar11 & 3) * 4 + (uVar11 >> 2 & 0x3fffffff) * 0x10 + lVar20) = 0xffffffff;
      *(undefined2 *)((long)&e->cart_infos[1].cgb_flag + uVar11 * 2 + lVar20) = 0x7fff;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x20);
    bVar22 = false;
  } while (bVar4);
  local_34 = pEVar7->random_seed;
  (e->state).random_seed = local_34;
  randomize_buffer(&local_34,(e->state).ext_ram.data,0x20000);
  randomize_buffer(&local_34,(e->state).wram.data,0x8000);
  randomize_buffer(&local_34,(e->state).hram,0x7f);
  (e->state).cpu_tick = 4;
  if ((e->state).ppu.lcdc.display == FALSE) {
    uVar11 = 0xffffffffffffffff;
  }
  else {
    uVar11 = (ulong)(e->state).ppu.state_ticks + (e->state).ppu.sync_ticks;
  }
  (e->state).ppu.next_intr_ticks = uVar11;
  uVar3 = (e->state).serial.next_intr_ticks;
  uVar13 = (e->state).timer.next_intr_ticks;
  if (uVar3 < uVar13) {
    uVar13 = uVar3;
  }
  if (uVar11 <= uVar13) {
    uVar13 = uVar11;
  }
  (e->state).next_intr_ticks = uVar13;
  return OK;
}

Assistant:

Result init_emulator(Emulator* e, const EmulatorInit* init) {
  static u8 s_initial_wave_ram[WAVE_RAM_SIZE] = {
      0x60, 0x0d, 0xda, 0xdd, 0x50, 0x0f, 0xad, 0xed,
      0xc0, 0xde, 0xf0, 0x0d, 0xbe, 0xef, 0xfe, 0xed,
  };
  CHECK(SUCCESS(get_cart_infos(e)));
  log_cart_info(e->cart_info);
  MMAP_STATE.rom_base[0] = 0;
  MMAP_STATE.rom_base[1] = 1 << ROM_BANK_SHIFT;
  IS_CGB = !init->force_dmg && (e->cart_info->cgb_flag == CGB_FLAG_SUPPORTED ||
                                e->cart_info->cgb_flag == CGB_FLAG_REQUIRED);
  IS_SGB = !init->force_dmg && !IS_CGB &&
           e->cart_info->sgb_flag == SGB_FLAG_SUPPORTED;
  set_af_reg(e, 0xb0);
  REG.A = IS_CGB ? 0x11 : 0x01;
  REG.BC = 0x0013;
  REG.DE = 0x00d8;
  REG.HL = 0x014d;
  REG.SP = 0xfffe;
  REG.PC = 0x0100;
  INTR.ime = FALSE;
  TIMER.div_counter = 0xAC00;
  TIMER.next_intr_ticks = SERIAL.next_intr_ticks = e->state.next_intr_ticks =
      INVALID_TICKS;
  WRAM.offset = 0x1000;
  /* Enable apu first, so subsequent writes succeed. */
  write_apu(e, APU_NR52_ADDR, 0xf1);
  write_apu(e, APU_NR11_ADDR, 0x80);
  write_apu(e, APU_NR12_ADDR, 0xf3);
  write_apu(e, APU_NR14_ADDR, 0x80);
  write_apu(e, APU_NR50_ADDR, 0x77);
  write_apu(e, APU_NR51_ADDR, 0xf3);
  APU.initialized = TRUE;
  memcpy(&WAVE.ram, s_initial_wave_ram, WAVE_RAM_SIZE);
  /* Turn down the volume on channel1, it is playing by default (because of the
   * GB startup sound), but we don't want to hear it when starting the
   * emulator. */
  CHANNEL1.envelope.volume = 0;
  write_io(e, IO_LCDC_ADDR, 0x91);
  write_io(e, IO_SCY_ADDR, 0x00);
  write_io(e, IO_SCX_ADDR, 0x00);
  write_io(e, IO_LYC_ADDR, 0x00);
  write_io(e, IO_BGP_ADDR, 0xfc);
  write_io(e, IO_OBP0_ADDR, 0xff);
  write_io(e, IO_OBP1_ADDR, 0xff);
  write_io(e, IO_IF_ADDR, 0x1);
  write_io(e, IO_IE_ADDR, 0x0);
  HDMA.blocks = 0xff;

  /* Set initial DMG/SGB palettes */
  emulator_set_builtin_palette(e, init->builtin_palette);

  /* Set up cgb color curve */
  e->cgb_color_curve = init->cgb_color_curve;

  /* Set initial CGB palettes to white. */
  int pal_index;
  for (pal_index = 0; pal_index < 2; ++pal_index) {
    ColorPalettes* palette = pal_index == 0 ? &PPU.bgcp : &PPU.obcp;
    int i;
    for (i = 0; i < 32; ++i) {
      palette->palettes[i >> 2].color[i & 3] = RGBA_WHITE;
      palette->data[i * 2] = 0xff;
      palette->data[i * 2 + 1] = 0x7f;
    }
  }

  /* Randomize RAM */
  u32 random_seed = init->random_seed;
  e->state.random_seed = random_seed;
  randomize_buffer(&random_seed, e->state.ext_ram.data, EXT_RAM_MAX_SIZE);
  randomize_buffer(&random_seed, e->state.wram.data, WORK_RAM_SIZE);
  randomize_buffer(&random_seed, e->state.hram, HIGH_RAM_SIZE);

  e->state.cpu_tick = CPU_TICK;
  calculate_next_ppu_intr(e);
  return OK;
  ON_ERROR_RETURN;
}